

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O2

LY_ERR tro_ext_printer_tree(ly_bool compiled,void *ext,lyspr_tree_ctx *plug_ctx,ly_bool *ignore)

{
  LY_ERR LVar1;
  undefined7 in_register_00000039;
  code *pcVar2;
  char *add_opts;
  char *flags;
  undefined8 local_10;
  undefined8 local_8;
  
  local_8 = 0;
  local_10 = 0;
  if ((int)CONCAT71(in_register_00000039,compiled) == 0) {
    pcVar2 = *(code **)(*(long *)((long)ext + 0x48) + 0x40);
  }
  else {
    pcVar2 = *(code **)(*(long *)(*ext + 0x18) + 0x20);
  }
  if (pcVar2 == (code *)0x0) {
    *ignore = '\x01';
    LVar1 = LY_SUCCESS;
  }
  else {
    LVar1 = (*pcVar2)(ext,plug_ctx,&local_8,&local_10);
  }
  return LVar1;
}

Assistant:

static LY_ERR
tro_ext_printer_tree(ly_bool compiled, void *ext, const struct lyspr_tree_ctx *plug_ctx, ly_bool *ignore)
{
    struct lysc_ext_instance *ext_comp;
    struct lysp_ext_instance *ext_pars;
    const struct lyplg_ext *plugin;
    const char *flags = NULL, *add_opts = NULL;

    if (compiled) {
        ext_comp = ext;
        plugin = ext_comp->def->plugin;
        if (!plugin->printer_ctree) {
            *ignore = 1;
            return LY_SUCCESS;
        }
        return plugin->printer_ctree(ext, plug_ctx, &flags, &add_opts);
    } else {
        ext_pars = ext;
        plugin = &ext_pars->record->plugin;
        if (!plugin->printer_ptree) {
            *ignore = 1;
            return LY_SUCCESS;
        }
        return plugin->printer_ptree(ext, plug_ctx, &flags, &add_opts);
    }

    return LY_SUCCESS;
}